

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::minUI32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *this_00;
  Literal *val;
  Literal *this_01;
  long lVar1;
  undefined1 local_120 [8];
  LaneArray<4> other_lanes;
  LaneArray<4> lanes;
  Literal local_48;
  
  getLanes<int,4>((LaneArray<4> *)&other_lanes._M_elems[3].type,(wasm *)this,other);
  getLanes<int,4>((LaneArray<4> *)local_120,(wasm *)other,val);
  lVar1 = 0;
  this_00 = &lanes._M_elems[3].type;
  do {
    this_01 = (Literal *)((long)&other_lanes._M_elems[3].type.id + lVar1);
    minUInt(&local_48,this_01,(Literal *)(local_120 + lVar1));
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  Literal(__return_storage_ptr__,(LaneArray<4> *)&other_lanes._M_elems[3].type);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)(local_120 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    ~Literal((Literal *)((long)&other_lanes._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::minUI32x4(const Literal& other) const {
  return binary<4, &Literal::getLanesI32x4, &Literal::minUInt>(*this, other);
}